

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,TexelBufferComputeInstance *this)

{
  void **ppvVar1;
  ShaderInputInterface SVar2;
  DescriptorUpdateMethod DVar3;
  VkDescriptorType type;
  ChannelOrder CVar4;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  VkFormat value;
  deUint32 numDescriptors;
  ostream *poVar11;
  DescriptorPoolBuilder *pDVar12;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  int resultNdx;
  long lVar13;
  TestStatus *__return_storage_ptr___00;
  byte bVar14;
  int *piVar15;
  char *pcVar16;
  ComputePipeline *this_00;
  pointer rawUpdateData;
  VkDescriptorSetLayout *descriptorSetLayouts;
  Vec4 *v;
  Vector<bool,_4> local_474;
  TestStatus *local_470;
  Vec4 result;
  ComputePipeline pipeline;
  VkDescriptorSet descriptorSets [1];
  Vec4 results [4];
  RefBase<vk::Handle<(vk::HandleType)19>_> local_3b8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_398;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_378;
  Vector<float,_4> local_358;
  Vec4 conversionThreshold;
  VkDescriptorSetAllocateInfo allocInfo;
  Vec4 reference;
  ostringstream msg;
  undefined4 uStack_1a4;
  Vector<unsigned_int,_3> local_188;
  uint local_17c;
  VkDevice local_178;
  int local_170;
  deUint32 *local_168;
  ChannelOrder local_160;
  VkBufferMemoryBarrier *local_158;
  int local_150;
  VkBufferMemoryBarrier *local_148;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar11 = std::operator<<((ostream *)&msg,"Fetching 4 values from image in compute shader.\n");
  poVar11 = std::operator<<(poVar11,"Single descriptor set. Descriptor set contains ");
  SVar2 = this->m_shaderInterface;
  if (SVar2 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar16 = "single";
  }
  else if (SVar2 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    pcVar16 = "two";
  }
  else {
    pcVar16 = (char *)0x0;
    if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      pcVar16 = "an array (size 2) of";
    }
  }
  poVar11 = std::operator<<(poVar11,pcVar16);
  poVar11 = std::operator<<(poVar11," descriptor(s) of type ");
  pcVar16 = ::vk::getDescriptorTypeName(this->m_descriptorType);
  poVar11 = std::operator<<(poVar11,pcVar16);
  poVar11 = std::operator<<(poVar11,"\n");
  poVar11 = std::operator<<(poVar11,"Buffer view is created with a ");
  pcVar16 = "View offset is zero, dynamic offset is zero";
  if (this->m_nonzeroViewOffset != false) {
    pcVar16 = "View offset is zero, dynamic offset is non-zero";
  }
  poVar11 = std::operator<<(poVar11,pcVar16 + 0x27);
  poVar11 = std::operator<<(poVar11," offset.\n");
  poVar11 = std::operator<<(poVar11,"Buffer format is ");
  value = ::vk::mapTextureFormat(&(this->m_texelBuffers).m_imageFormat);
  pcVar16 = ::vk::getFormatName(value);
  poVar11 = std::operator<<(poVar11,pcVar16);
  std::operator<<(poVar11,".\n");
  piVar15 = &BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::getFetchPos(int)::
             fetchPositions;
  local_470 = __return_storage_ptr__;
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    poVar11 = std::operator<<((ostream *)&msg,"Test sample ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(uint)lVar13);
    poVar11 = std::operator<<(poVar11,": fetch at position ");
    std::ostream::operator<<(poVar11,*piVar15);
    if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      poVar11 = std::operator<<((ostream *)&msg," from texelBuffer ");
      std::ostream::operator<<(poVar11,(uint)lVar13 & 1);
    }
    std::operator<<((ostream *)&msg,"\n");
    piVar15 = piVar15 + 1;
  }
  allocInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar1 = &allocInfo.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)ppvVar1,(string *)&pipeline);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&pipeline);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&allocInfo);
  DVar3 = this->m_updateMethod;
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)&allocInfo,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  SVar2 = this->m_shaderInterface;
  if (SVar2 != SHADER_INPUT_SINGLE_DESCRIPTOR) {
    if (SVar2 != SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        ::vk::DescriptorSetLayoutBuilder::addArrayBinding
                  ((DescriptorSetLayoutBuilder *)&allocInfo,this->m_descriptorType,2,0x20);
      }
      goto LAB_00547727;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)&allocInfo,this->m_descriptorType,0x20);
  }
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)&allocInfo,this->m_descriptorType,0x20);
LAB_00547727:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&msg,(DescriptorSetLayoutBuilder *)&allocInfo,
             this->m_vki,this->m_device,
             (uint)((DVar3 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&allocInfo);
  local_3b8.m_data.object.m_internal = _msg;
  _msg = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&msg);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&msg);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  type = this->m_descriptorType;
  numDescriptors = getInterfaceNumResources(this->m_shaderInterface);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType(pDVar12,type,numDescriptors);
  descriptorSetLayouts = (VkDescriptorSetLayout *)0x1;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo,pDVar12,this->m_vki,this->m_device,
             1,1);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&msg);
  local_378.m_data.object.m_internal = allocInfo._0_8_;
  local_378.m_data.deleter.m_deviceIface = (DeviceInterface *)allocInfo.pNext;
  local_378.m_data.deleter.m_device = (VkDevice)allocInfo.descriptorPool.m_internal;
  local_378.m_data.deleter.m_allocator = (VkAllocationCallbacks *)allocInfo._24_8_;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&allocInfo);
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)&result;
  result.m_data[0] = (float)(undefined4)local_3b8.m_data.object.m_internal;
  result.m_data[1] = (float)local_3b8.m_data.object.m_internal._4_4_;
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = local_378.m_data.object.m_internal;
  allocInfo.descriptorSetCount = 1;
  results[0].m_data[0] = 0.0;
  results[0].m_data[1] = 0.0;
  results[0].m_data[2] = 0.0;
  results[0].m_data[3] = 0.0;
  results[1].m_data[0] = 0.0;
  results[1].m_data[1] = 0.0;
  results[1].m_data[2] = 0.0;
  results[1].m_data[3] = 0.0;
  if ((this->m_updateMethod & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
      DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    _msg = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)results);
    results[1].m_data[0] = 0.0;
    results[1].m_data[1] = 0.0;
    results[1].m_data[2] = 0.0;
    results[1].m_data[3] = 0.0;
    results[0].m_data[0] = 0.0;
    results[0].m_data[1] = 0.0;
    results[0].m_data[2] = 0.0;
    results[0].m_data[3] = 0.0;
    this_00 = (ComputePipeline *)&msg;
  }
  else {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&pipeline,this->m_vki,this->m_device,
               &allocInfo);
    pVVar7 = pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
             .m_allocator;
    pVVar6 = pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
             .m_device;
    pDVar5 = pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
             .m_deviceIface;
    _msg = pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
           m_internal;
    pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
    m_internal = 0;
    pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
         = (VkDevice)0x0;
    pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)results);
    results[1].m_data._0_8_ = pVVar6;
    results[1].m_data._8_8_ = pVVar7;
    results[0].m_data[0] = (float)_msg;
    results[0].m_data[1] = (float)uStack_1a4;
    results[0].m_data._8_8_ = pDVar5;
    this_00 = &pipeline;
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)this_00);
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    writeDescriptorSet(this,(VkDescriptorSet)results[0].m_data._0_8_);
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    writeDescriptorSetWithTemplate
              (this,(VkDescriptorSet)results[0].m_data._0_8_,
               (VkDescriptorSetLayout)result.m_data._0_8_,false,(VkPipelineLayout)0x0);
  }
  local_398.m_data.object.m_internal._0_4_ = results[0].m_data[0];
  local_398.m_data.object.m_internal._4_4_ = results[0].m_data[1];
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)results[0].m_data._8_8_;
  local_398.m_data.deleter.m_device = (VkDevice)results[1].m_data._0_8_;
  local_398.m_data.deleter.m_pool.m_internal._0_4_ = results[1].m_data[2];
  local_398.m_data.deleter.m_pool.m_internal._4_4_ = results[1].m_data[3];
  results[0].m_data[0] = 0.0;
  results[0].m_data[1] = 0.0;
  results[0].m_data[2] = 0.0;
  results[0].m_data[3] = 0.0;
  results[1].m_data[0] = 0.0;
  results[1].m_data[1] = 0.0;
  results[1].m_data[2] = 0.0;
  results[1].m_data[3] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)results);
  ComputePipeline::ComputePipeline
            (&pipeline,this->m_vki,this->m_device,
             ((this->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_3b8,
             descriptorSetLayouts);
  descriptorSets[0].m_internal =
       (VkDescriptorSet)(VkDescriptorSet)local_398.m_data.object.m_internal;
  DVar3 = this->m_updateMethod;
  CVar4 = (this->m_texelBuffers).m_numTexelBuffers;
  allocInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  allocInfo._4_4_ = 1;
  allocInfo.pNext = (void *)CONCAT44(allocInfo.pNext._4_4_,1);
  _msg = (deUint64)this->m_vki;
  tcu::Vector<unsigned_int,_3>::Vector(&local_188,(Vector<unsigned_int,_3> *)&allocInfo);
  local_17c = (uint)(DVar3 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  local_178 = (VkDevice)descriptorSets;
  local_170 = 0;
  local_168 = (deUint32 *)0x0;
  lVar13 = 0;
  local_160 = CVar4;
  local_158 = (this->m_texelBuffers).m_bufferBarriers;
  local_150 = 1;
  local_148 = &(this->m_result).m_bufferBarrier;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)results[0].m_data + lVar13));
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(this,(VkDescriptorSet)0x0);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)&msg,this->m_queueFamilyIndex,this->m_queue,&this->m_updateBuilder)
    ;
  }
  else {
    updateTemplate.m_internal = 0;
    rawUpdateData = (pointer)0x0;
    if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSetWithTemplate
                (this,(VkDescriptorSet)0x0,(VkDescriptorSetLayout)local_3b8.m_data.object.m_internal
                 ,true,(VkPipelineLayout)
                       pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.object.m_internal);
      updateTemplate.m_internal =
           (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (this->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ComputeCommand::submitAndWait
              ((ComputeCommand *)&msg,this->m_queueFamilyIndex,this->m_queue,updateTemplate,
               rawUpdateData);
  }
  v = results;
  ComputeInstanceResultBuffer::readResultContentsTo(&this->m_result,&v);
  bVar8 = true;
  bVar14 = 0;
  for (lVar13 = 0; __return_storage_ptr___00 = local_470, lVar13 != 4; lVar13 = lVar13 + 1) {
    tcu::Vector<float,_4>::Vector(&result,v);
    TexelBufferInstanceBuffers::fetchTexelValue
              ((TexelBufferInstanceBuffers *)&reference,(int)this + 0xe0);
    tcu::Vector<float,_4>::Vector(&conversionThreshold,0.003921569);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&allocInfo,-1.0);
    bVar9 = tcu::Vector<float,_4>::operator!=(&result,(Vector<float,_4> *)&allocInfo);
    tcu::operator-((tcu *)&local_358,&result,(Vector<float,_4> *)&reference);
    tcu::abs<float,4>((tcu *)&allocInfo,&local_358);
    tcu::greaterThan<float,4>((tcu *)&local_474,(Vector<float,_4> *)&allocInfo,&conversionThreshold)
    ;
    bVar10 = tcu::boolAny<4>(&local_474);
    if (bVar10) {
      allocInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar1 = &allocInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Test sample ");
      std::ostream::operator<<(ppvVar1,(int)lVar13);
      std::operator<<((ostream *)ppvVar1,": Expected ");
      tcu::operator<<((ostream *)ppvVar1,(Vector<float,_4> *)&reference);
      std::operator<<((ostream *)ppvVar1,", got ");
      tcu::operator<<((ostream *)ppvVar1,&result);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&allocInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      bVar8 = false;
    }
    bVar14 = bVar14 | bVar9;
    v = v + 1;
  }
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allocInfo,"Pass",(allocator<char> *)&result);
    __return_storage_ptr___00 = local_470;
    tcu::TestStatus::pass(local_470,(string *)&allocInfo);
  }
  else if (bVar14 == 0) {
    allocInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    ppvVar1 = &allocInfo.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
    std::operator<<((ostream *)ppvVar1,"Result buffer was not written to.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&allocInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allocInfo,"Result buffer was not written to",(allocator<char> *)&result);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&allocInfo);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allocInfo,"Invalid result values",(allocator<char> *)&result);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&allocInfo);
  }
  std::__cxx11::string::~string((string *)&allocInfo);
  ComputePipeline::~ComputePipeline(&pipeline);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_398);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_378);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_3b8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus TexelBufferComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}